

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode AddFormData(FormData **formp,formtype type,void *line,curl_off_t length,curl_off_t *size)

{
  int iVar1;
  FormData *pFVar2;
  char *pcVar3;
  undefined1 local_e0 [8];
  stat file;
  char *pcStack_48;
  CURLcode result;
  char *alloc2;
  FormData *newform;
  curl_off_t *size_local;
  curl_off_t length_local;
  void *line_local;
  formtype type_local;
  FormData **formp_local;
  
  pcStack_48 = (char *)0x0;
  file.__glibc_reserved[2]._4_4_ = 0;
  if ((length < 0) || ((size != (curl_off_t *)0x0 && (*size < 0)))) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  pFVar2 = (FormData *)(*Curl_cmalloc)(0x20);
  if (pFVar2 == (FormData *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pFVar2->next = (FormData *)0x0;
  size_local = (curl_off_t *)length;
  line_local._4_4_ = type;
  if (type < FORM_CALLBACK) {
    if (length == 0) {
      size_local = (curl_off_t *)strlen((char *)line);
    }
    if (type == FORM_DATAMEM) {
      pFVar2->line = (char *)line;
      line_local._4_4_ = FORM_DATA;
LAB_00a7e811:
      pFVar2->length = (size_t)size_local;
      goto LAB_00a7e82b;
    }
    pcVar3 = (char *)(*Curl_cmalloc)((long)size_local + 1);
    pFVar2->line = pcVar3;
    if (pFVar2->line != (char *)0x0) {
      pcStack_48 = pFVar2->line;
      memcpy(pFVar2->line,line,(size_t)size_local);
      pFVar2->line[(long)size_local] = '\0';
      goto LAB_00a7e811;
    }
    file.__glibc_reserved[2]._4_4_ = CURLE_OUT_OF_MEMORY;
LAB_00a7e8f1:
    if (pFVar2 != (FormData *)0x0) {
      (*Curl_cfree)(pFVar2);
    }
    if (pcStack_48 != (char *)0x0) {
      (*Curl_cfree)(pcStack_48);
    }
    formp_local._4_4_ = file.__glibc_reserved[2]._4_4_;
  }
  else {
    pFVar2->line = (char *)line;
LAB_00a7e82b:
    pFVar2->type = line_local._4_4_;
    if (size != (curl_off_t *)0x0) {
      if (line_local._4_4_ == FORM_FILE) {
        iVar1 = strcmp("-",pFVar2->line);
        if (iVar1 != 0) {
          iVar1 = stat64(pFVar2->line,(stat64 *)local_e0);
          if ((iVar1 != 0) || (((uint)file.st_nlink & 0xf000) == 0x4000)) {
            file.__glibc_reserved[2]._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
            goto LAB_00a7e8f1;
          }
          *size = file.st_rdev + *size;
        }
      }
      else {
        *size = (long)size_local + *size;
      }
    }
    if (*formp == (FormData *)0x0) {
      *formp = pFVar2;
    }
    else {
      (*formp)->next = pFVar2;
      *formp = pFVar2;
    }
    formp_local._4_4_ = CURLE_OK;
  }
  return formp_local._4_4_;
}

Assistant:

static CURLcode AddFormData(struct FormData **formp,
                            enum formtype type,
                            const void *line,
                            curl_off_t length,
                            curl_off_t *size)
{
  struct FormData *newform;
  char *alloc2 = NULL;
  CURLcode result = CURLE_OK;
  if(length < 0 || (size && *size < 0))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  newform = malloc(sizeof(struct FormData));
  if(!newform)
    return CURLE_OUT_OF_MEMORY;
  newform->next = NULL;

  if(type <= FORM_CONTENT) {
    /* we make it easier for plain strings: */
    if(!length)
      length = strlen((char *)line);
#if (SIZEOF_SIZE_T < CURL_SIZEOF_CURL_OFF_T)
    else if(length >= (curl_off_t)(size_t)-1) {
      result = CURLE_BAD_FUNCTION_ARGUMENT;
      goto error;
    }
#endif
    if(type != FORM_DATAMEM) {
      newform->line = malloc((size_t)length+1);
      if(!newform->line) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
      alloc2 = newform->line;
      memcpy(newform->line, line, (size_t)length);

      /* zero terminate for easier debugging */
      newform->line[(size_t)length]=0;
    }
    else {
      newform->line = (char *)line;
      type = FORM_DATA; /* in all other aspects this is just FORM_DATA */
    }
    newform->length = (size_t)length;
  }
  else
    /* For callbacks and files we don't have any actual data so we just keep a
       pointer to whatever this points to */
    newform->line = (char *)line;

  newform->type = type;

  if(size) {
    if(type != FORM_FILE)
      /* for static content as well as callback data we add the size given
         as input argument */
      *size += length;
    else {
      /* Since this is a file to be uploaded here, add the size of the actual
         file */
      if(strcmp("-", newform->line)) {
        struct_stat file;
        if(!stat(newform->line, &file) && !S_ISDIR(file.st_mode))
          *size += filesize(newform->line, file);
        else {
          result = CURLE_BAD_FUNCTION_ARGUMENT;
          goto error;
        }
      }
    }
  }

  if(*formp) {
    (*formp)->next = newform;
    *formp = newform;
  }
  else
    *formp = newform;

  return CURLE_OK;
  error:
  if(newform)
    free(newform);
  if(alloc2)
    free(alloc2);
  return result;
}